

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void __thiscall absl::lts_20250127::CondVar::SignalAll(CondVar *this)

{
  ulong uVar1;
  ulong uVar2;
  PerThreadSynch *pPVar3;
  int c;
  ulong uVar4;
  PerThreadSynch *pPVar5;
  PerThreadSynch *w;
  bool bVar6;
  
  c = 0;
  do {
    uVar2 = *(ulong *)this;
    if (uVar2 == 0) {
      return;
    }
    if ((uVar2 & 1) == 0) {
      uVar4 = (ulong)((uint)uVar2 & 2);
      LOCK();
      uVar1 = *(ulong *)this;
      if (uVar2 == uVar1) {
        *(ulong *)this = uVar4;
      }
      UNLOCK();
      if (uVar2 == uVar1) {
        pPVar5 = (PerThreadSynch *)(uVar2 & 0xfffffffffffffffc);
        if (pPVar5 != (PerThreadSynch *)0x0) {
          w = pPVar5->next;
          do {
            pPVar3 = w->next;
            Mutex::Fer(w->waitp->cvmu,w);
            bVar6 = w != pPVar5;
            w = pPVar3;
          } while (bVar6);
          (*(code *)lts_20250127::(anonymous_namespace)::cond_var_tracer)("SignalAll wakeup",this);
        }
        if (uVar4 == 0) {
          return;
        }
        PostSynchEvent(this,0xd);
        return;
      }
    }
    c = synchronization_internal::MutexDelay(c,1);
  } while( true );
}

Assistant:

void CondVar::SignalAll() {
  ABSL_TSAN_MUTEX_PRE_SIGNAL(nullptr, 0);
  intptr_t v;
  int c = 0;
  for (v = cv_.load(std::memory_order_relaxed); v != 0;
       v = cv_.load(std::memory_order_relaxed)) {
    // empty the list if spinlock free
    // We do this by simply setting the list to empty using
    // compare and swap.   We then have the entire list in our hands,
    // which cannot be changing since we grabbed it while no one
    // held the lock.
    if ((v & kCvSpin) == 0 &&
        cv_.compare_exchange_strong(v, v & kCvEvent, std::memory_order_acquire,
                                    std::memory_order_relaxed)) {
      PerThreadSynch* h = reinterpret_cast<PerThreadSynch*>(v & ~kCvLow);
      if (h != nullptr) {
        PerThreadSynch* w;
        PerThreadSynch* n = h->next;
        do {  // for every thread, wake it up
          w = n;
          n = n->next;
          w->waitp->cvmu->Fer(w);
        } while (w != h);
        cond_var_tracer("SignalAll wakeup", this);
      }
      if ((v & kCvEvent) != 0) {
        PostSynchEvent(this, SYNCH_EV_SIGNALALL);
      }
      ABSL_TSAN_MUTEX_POST_SIGNAL(nullptr, 0);
      return;
    } else {
      // try again after a delay
      c = synchronization_internal::MutexDelay(c, GENTLE);
    }
  }
  ABSL_TSAN_MUTEX_POST_SIGNAL(nullptr, 0);
}